

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddImportedTarget(cmMakefile *this,string *name,TargetType type,bool global)

{
  cmTarget *pcVar1;
  __uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_> this_00;
  __uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_> *p_Var2;
  undefined7 in_register_00000009;
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> target;
  cmStateDirectory local_70;
  cmStateSnapshot local_48;
  
  this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
       (tuple<cmTarget_*,_std::default_delete<cmTarget>_>)operator_new(8);
  cmTarget::cmTarget((cmTarget *)
                     this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>
                     .super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl,name,type,
                     (int)CONCAT71(in_register_00000009,global) + VisibilityImported,this,Yes);
  target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
  super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmTarget,_std::default_delete<cmTarget>,_true,_true>)
       (__uniq_ptr_data<cmTarget,_std::default_delete<cmTarget>,_true,_true>)
       this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
       super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
  p_Var2 = (__uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_> *)
           std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->ImportedTargets,name);
  p_Var2->_M_t = this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                 super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
  cmGlobalGenerator::IndexTarget
            (this->GlobalGenerator,
             (cmTarget *)
             target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
             super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
             super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl);
  local_48.Position.Position = (this->StateSnapshot).Position.Position;
  local_48.State = (this->StateSnapshot).State;
  local_48.Position.Tree = (this->StateSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory(&local_70,&local_48);
  cmStateDirectory::AddImportedTargetName(&local_70,name);
  std::
  vector<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>,std::allocator<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>>>
  ::emplace_back<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>>
            ((vector<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>,std::allocator<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>>>
              *)&this->ImportedTargetsOwned,&target);
  pcVar1 = (this->ImportedTargetsOwned).
           super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
           super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
           super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
  std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::~unique_ptr(&target);
  return pcVar1;
}

Assistant:

cmTarget* cmMakefile::AddImportedTarget(const std::string& name,
                                        cmStateEnums::TargetType type,
                                        bool global)
{
  // Create the target.
  std::unique_ptr<cmTarget> target(
    new cmTarget(name, type,
                 global ? cmTarget::VisibilityImportedGlobally
                        : cmTarget::VisibilityImported,
                 this, cmTarget::PerConfig::Yes));

  // Add to the set of available imported targets.
  this->ImportedTargets[name] = target.get();
  this->GetGlobalGenerator()->IndexTarget(target.get());
  this->GetStateSnapshot().GetDirectory().AddImportedTargetName(name);

  // Transfer ownership to this cmMakefile object.
  this->ImportedTargetsOwned.push_back(std::move(target));
  return this->ImportedTargetsOwned.back().get();
}